

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O1

void fight_prog_devils_eye(OBJ_DATA *obj,CHAR_DATA *ch)

{
  CHAR_DATA *victim;
  bool bVar1;
  int iVar2;
  
  bVar1 = is_worn(obj);
  if (bVar1) {
    iVar2 = number_percent();
    if (iVar2 < 5) {
      act("The Devil\'s Eye suddenly pivots and stares directly into $n\'s face!",ch,(void *)0x0,
          ch->fighting,1);
      act("The Devil\'s Eye suddenly pivots and stares directly into your face!",ch,(void *)0x0,
          ch->fighting,2);
      victim = ch->fighting;
      iVar2 = dice(0xc,0xc);
      damage_new(ch,victim,iVar2,-1,3,true,false,0,1,"heartquake");
    }
  }
  return;
}

Assistant:

void fight_prog_devils_eye(OBJ_DATA *obj, CHAR_DATA *ch)
{
	if (!is_worn(obj))
		return;

	if (number_percent() < 5)
	{
		act("The Devil's Eye suddenly pivots and stares directly into $n's face!", ch, 0, ch->fighting, TO_NOTVICT);
		act("The Devil's Eye suddenly pivots and stares directly into your face!", ch, 0, ch->fighting, TO_VICT);
		damage_new(ch, ch->fighting, dice(12, 12), TYPE_UNDEFINED, DAM_SLASH, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "heartquake");
	}
}